

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZmqCommsSS.cpp
# Opt level: O0

void __thiscall helics::zeromq::ZmqCommsSS::~ZmqCommsSS(ZmqCommsSS *this)

{
  void *in_RDI;
  ZmqCommsSS *unaff_retaddr;
  
  ~ZmqCommsSS(unaff_retaddr);
  operator_delete(in_RDI,0x4c0);
  return;
}

Assistant:

ZmqCommsSS::~ZmqCommsSS()
{
    if (requestDisconnect.load() || disconnecting.load()) {
        auto status = getRxStatus();
        while (status != ConnectionStatus::TERMINATED && status != ConnectionStatus::ERRORED) {
            std::this_thread::yield();
            status = getRxStatus();
        }
    } else {
        disconnect();
    }
}